

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChMatterSPH::VariablesQbSetSpeed(ChMatterSPH *this,double step)

{
  double dVar1;
  double dVar2;
  pointer psVar3;
  element_type *peVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  double dVar8;
  ChVector<double> local_98;
  ChVectorRef local_80;
  MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_68 [56];
  
  uVar6 = 0;
  dVar8 = 1.0 / step;
  while( true ) {
    uVar7 = (ulong)uVar6;
    psVar3 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <= uVar7)
    break;
    peVar4 = psVar3[uVar7].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auVar5 = *(undefined1 (*) [16])
              ((ChVector<double> *)((long)&peVar4->super_ChNodeXYZ + 0x20))->m_data;
    dVar1 = *(double *)((long)&peVar4->super_ChNodeXYZ + 0x30);
    ChVariables::Get_qb(&local_80,&(peVar4->variables).super_ChVariables);
    Eigen::
    VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
    VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
                 *)local_68,&local_80,0,3);
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_98,local_68,(type *)0x0);
    if ((ChVector<double> *)((long)&peVar4->super_ChNodeXYZ + 0x20U) != &local_98) {
      ((ChVector<double> *)((long)&peVar4->super_ChNodeXYZ + 0x20))->m_data[0] = local_98.m_data[0];
      *(double *)((long)&peVar4->super_ChNodeXYZ + 0x28) = local_98.m_data[1];
      *(double *)((long)&peVar4->super_ChNodeXYZ + 0x30) = local_98.m_data[2];
    }
    if ((step != 0.0) || (NAN(step))) {
      peVar4 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7].
               super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      dVar2 = *(double *)((long)&peVar4->super_ChNodeXYZ + 0x30);
      auVar5 = vsubpd_avx(*(undefined1 (*) [16])
                           ((ChVector<double> *)((long)&peVar4->super_ChNodeXYZ + 0x20))->m_data,
                          auVar5);
      ((ChVector<double> *)((long)&peVar4->super_ChNodeXYZ + 0x38))->m_data[0] =
           auVar5._0_8_ * dVar8;
      *(double *)((long)&peVar4->super_ChNodeXYZ + 0x40) = auVar5._8_8_ * dVar8;
      *(double *)((long)&peVar4->super_ChNodeXYZ + 0x48) = (dVar2 - dVar1) * dVar8;
    }
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void ChMatterSPH::VariablesQbSetSpeed(double step) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        ChVector<> old_pos_dt = nodes[j]->GetPos_dt();

        // from 'qb' vector, sets body speed, and updates auxiliary data
        nodes[j]->SetPos_dt(nodes[j]->variables.Get_qb().segment(0, 3));

        // Compute accel. by BDF (approximate by differentiation);
        if (step) {
            nodes[j]->SetPos_dtdt((nodes[j]->GetPos_dt() - old_pos_dt) / step);
        }
    }
}